

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

void do_raise_exception_err_mips64
               (CPUMIPSState_conflict5 *env,uint32_t exception,int error_code,uintptr_t pc)

{
  *(uint32_t *)env[-1].tcs[0xd].HI = exception;
  env->error_code = error_code;
  if (exception == 0x11) {
    env->uc->next_pc = (env->active_tc).PC + 4;
  }
  cpu_loop_exit_restore_mips64((CPUState *)(env[-3].tcs[0xc].gpr + 0x12),pc);
}

Assistant:

void QEMU_NORETURN do_raise_exception_err(CPUMIPSState *env,
                                          uint32_t exception,
                                          int error_code,
                                          uintptr_t pc)
{
    CPUState *cs = env_cpu(env);

#if 0
    qemu_log_mask(CPU_LOG_INT, "%s: %d %d\n",
                  __func__, exception, error_code);
#endif
    cs->exception_index = exception;
    env->error_code = error_code;

    // Unicorn: Imported from https://github.com/unicorn-engine/unicorn/pull/1098
    if (exception == 0x11){
        env->uc->next_pc = env->active_tc.PC + 4;
    }

    cpu_loop_exit_restore(cs, pc);
}